

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O3

void Diligent::PipelineStateUtils::
     ExtractShaders<Diligent::SerializedShaderImpl,std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>>>
               (RayTracingPipelineStateCreateInfo *CreateInfo,
               vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
               *ShaderStages,bool WaitUntilShadersReady,SHADER_TYPE *ActiveShaderStages)

{
  pointer pvVar1;
  Int32 IVar2;
  pointer pSVar3;
  undefined4 *puVar4;
  pointer pSVar5;
  size_t sVar6;
  undefined7 in_register_00000011;
  SHADER_TYPE *pSVar7;
  pointer pSVar8;
  undefined1 *puVar9;
  char *__p;
  pointer pSVar10;
  ulong uVar11;
  long lVar12;
  string msg_1;
  anon_class_32_4_a6542874 AddShader;
  unordered_set<Diligent::IShader_*,_std::hash<Diligent::IShader_*>,_std::equal_to<Diligent::IShader_*>,_std::allocator<Diligent::IShader_*>_>
  UniqueShaders;
  undefined1 local_b8 [32];
  _Tp_alloc_type *local_98;
  SHADER_TYPE *local_90;
  anon_class_32_4_a6542874 local_88;
  undefined1 local_68 [32];
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  pSVar7 = (SHADER_TYPE *)CONCAT71(in_register_00000011,WaitUntilShadersReady);
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_RAY_TRACING)
  {
    FormatString<char[26],char[42]>
              ((string *)local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.IsRayTracingPipeline()",
               (char (*) [42])ActiveShaderStages);
    ActiveShaderStages = (SHADER_TYPE *)0x118;
    DebugAssertionFailed
              ((Char *)local_68._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x118);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
  }
  local_68._0_8_ = &p_Stack_38;
  local_68._8_8_ = 1;
  local_68._16_8_ = 0;
  local_68._24_8_ = 0;
  local_48 = 1.0;
  local_40 = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  local_88.UniqueShaders =
       (unordered_set<Diligent::IShader_*,_std::hash<Diligent::IShader_*>,_std::equal_to<Diligent::IShader_*>,_std::allocator<Diligent::IShader_*>_>
        *)local_68;
  local_88.WaitUntilShadersReady = true;
  local_88.ShaderStages = ShaderStages;
  local_88.ActiveShaderStages = pSVar7;
  std::
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
  ::_M_erase_at_end(ShaderStages,
                    (ShaderStages->
                    super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  pSVar3 = (ShaderStages->
           super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pSVar5 = (ShaderStages->
           super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar12 = (long)pSVar5 - (long)pSVar3;
  pSVar8 = (pointer)((lVar12 >> 4) * -0x3333333333333333);
  if (pSVar8 < (pointer)0x6) {
    pSVar10 = (pointer)((lVar12 >> 4) * 0x3333333333333333 + 6);
    ActiveShaderStages =
         (SHADER_TYPE *)
         (((long)(ShaderStages->
                 super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                 )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar5 >> 4) *
         -0x3333333333333333);
    if (ActiveShaderStages < pSVar10) {
      pSVar5 = pSVar10;
      if (pSVar10 <= pSVar8 && (long)pSVar8 - (long)pSVar10 != 0) {
        pSVar5 = pSVar8;
      }
      local_98 = (_Tp_alloc_type *)((long)pSVar5 + (long)pSVar8);
      local_90 = pSVar7;
      pSVar3 = std::
               _Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
               ::_M_allocate((_Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                              *)local_98,(size_t)pSVar3);
      puVar9 = (undefined1 *)
               ((long)&pSVar8[-1].Serialized.
                       super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 2);
      puVar4 = (undefined4 *)(lVar12 + (long)pSVar3);
      do {
        *puVar4 = 0;
        *(undefined8 *)(puVar4 + 2) = 0;
        *(undefined8 *)(puVar4 + 4) = 0;
        *(undefined8 *)(puVar4 + 6) = 0;
        *(undefined8 *)(puVar4 + 8) = 0;
        *(undefined8 *)(puVar4 + 10) = 0;
        *(undefined8 *)(puVar4 + 0xc) = 0;
        *(undefined8 *)(puVar4 + 0xe) = 0;
        *(undefined8 *)(puVar4 + 0x10) = 0;
        *(undefined8 *)(puVar4 + 0x12) = 0;
        puVar4 = puVar4 + 0x14;
        puVar9 = puVar9 + 1;
      } while (puVar9 != (undefined1 *)0x0);
      std::
      vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      ::_S_relocate((ShaderStages->
                    super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                    )._M_impl.super__Vector_impl_data._M_start,
                    (ShaderStages->
                    super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                    )._M_impl.super__Vector_impl_data._M_finish,pSVar3,
                    (_Tp_alloc_type *)ActiveShaderStages);
      pSVar5 = (ShaderStages->
               super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (pSVar5 != (pointer)0x0) {
        operator_delete(pSVar5,(long)(ShaderStages->
                                     super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pSVar5);
      }
      (ShaderStages->
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      )._M_impl.super__Vector_impl_data._M_start = pSVar3;
      (ShaderStages->
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      )._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(lVar12 + (long)pSVar3 + (ulong)(uint)((int)pSVar10 * 0x50));
      (ShaderStages->
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar3 + (long)local_98;
      pSVar7 = local_90;
    }
    else {
      puVar9 = (undefined1 *)
               ((long)&pSVar8[-1].Serialized.
                       super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 2);
      do {
        (pSVar5->super_ShaderStageInfo).Type = SHADER_TYPE_UNKNOWN;
        (pSVar5->super_ShaderStageInfo).Shaders.
        super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pSVar5->super_ShaderStageInfo).Shaders.
        super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pSVar5->super_ShaderStageInfo).Shaders.
        super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pSVar5->super_ShaderStageInfo).SPIRVs.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pSVar5->super_ShaderStageInfo).SPIRVs.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pSVar5->super_ShaderStageInfo).SPIRVs.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pSVar5->Serialized).
        super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pSVar5->Serialized).
        super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pSVar5->Serialized).
        super__Vector_base<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pSVar5 = pSVar5 + 1;
        puVar9 = puVar9 + 1;
      } while (puVar9 != (undefined1 *)0x0);
      (ShaderStages->
      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
      )._M_impl.super__Vector_impl_data._M_finish = pSVar5;
    }
  }
  else if (lVar12 != 0x1e0) {
    std::
    vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
    ::_M_erase_at_end(ShaderStages,pSVar3 + 6);
  }
  *pSVar7 = SHADER_TYPE_UNKNOWN;
  if (CreateInfo->GeneralShaderCount != 0) {
    lVar12 = 8;
    uVar11 = 0;
    do {
      ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_88,*(IShader **)((long)&CreateInfo->pGeneralShaders->Name + lVar12));
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x10;
    } while (uVar11 < CreateInfo->GeneralShaderCount);
  }
  if (CreateInfo->TriangleHitShaderCount != 0) {
    lVar12 = 0;
    uVar11 = 0;
    do {
      ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_88,
                 *(IShader **)((long)&CreateInfo->pTriangleHitShaders->pClosestHitShader + lVar12));
      ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_88,
                 *(IShader **)((long)&CreateInfo->pTriangleHitShaders->pAnyHitShader + lVar12));
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x18;
    } while (uVar11 < CreateInfo->TriangleHitShaderCount);
  }
  if (CreateInfo->ProceduralHitShaderCount != 0) {
    lVar12 = 0;
    uVar11 = 0;
    do {
      ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_88,
                 *(IShader **)
                  ((long)&CreateInfo->pProceduralHitShaders->pIntersectionShader + lVar12));
      ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_88,
                 *(IShader **)((long)&CreateInfo->pProceduralHitShaders->pClosestHitShader + lVar12)
                );
      ExtractShaders<Diligent::SerializedShaderImpl,_std::vector<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>_>
      ::anon_class_32_4_a6542874::operator()
                (&local_88,
                 *(IShader **)((long)&CreateInfo->pProceduralHitShaders->pAnyHitShader + lVar12));
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x20;
    } while (uVar11 < CreateInfo->ProceduralHitShaderCount);
  }
  __p = (char *)0x3;
  IVar2 = GetShaderTypePipelineIndex(SHADER_TYPE_RAY_GEN,PIPELINE_TYPE_RAY_TRACING);
  sVar6 = PipelineStateVkImpl::ShaderStageInfo::Count
                    (&(ShaderStages->
                      super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                      )._M_impl.super__Vector_impl_data._M_start[IVar2].super_ShaderStageInfo);
  if (sVar6 == 0) {
    __p = "ExtractShaders";
    ActiveShaderStages = (SHADER_TYPE *)0x142;
    LogError<true,char[68]>
              (false,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x142,(char (*) [68])
                      "At least one shader with type SHADER_TYPE_RAY_GEN must be provided.");
  }
  pSVar3 = (ShaderStages->
           super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pSVar3 != (ShaderStages->
                super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      sVar6 = PipelineStateVkImpl::ShaderStageInfo::Count(&pSVar3->super_ShaderStageInfo);
      if (sVar6 == 0) {
        ActiveShaderStages = (SHADER_TYPE *)(pSVar3 + 1);
        pSVar5 = (ShaderStages->
                 super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (((pointer)ActiveShaderStages != pSVar5) && (0 < (long)pSVar5 - (long)ActiveShaderStages)
           ) {
          uVar11 = (ulong)((long)pSVar5 - (long)ActiveShaderStages) / 0x50 + 1;
          pSVar5 = pSVar3;
          do {
            (pSVar5->super_ShaderStageInfo).Type = pSVar5[1].super_ShaderStageInfo.Type;
            std::
            vector<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
            ::_M_move_assign(&(pSVar5->super_ShaderStageInfo).Shaders,
                             &pSVar5[1].super_ShaderStageInfo.Shaders);
            local_b8._16_8_ =
                 (pSVar5->super_ShaderStageInfo).SPIRVs.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pvVar1 = pSVar5[1].super_ShaderStageInfo.SPIRVs.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            local_b8._0_8_ =
                 (pSVar5->super_ShaderStageInfo).SPIRVs.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_b8._8_8_ =
                 (pSVar5->super_ShaderStageInfo).SPIRVs.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            (pSVar5->super_ShaderStageInfo).SPIRVs.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 pSVar5[1].super_ShaderStageInfo.SPIRVs.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            (pSVar5->super_ShaderStageInfo).SPIRVs.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pvVar1;
            ActiveShaderStages =
                 (SHADER_TYPE *)
                 pSVar5[1].super_ShaderStageInfo.SPIRVs.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (pSVar5->super_ShaderStageInfo).SPIRVs.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ActiveShaderStages;
            pSVar5[1].super_ShaderStageInfo.SPIRVs.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            pSVar5[1].super_ShaderStageInfo.SPIRVs.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            pSVar5[1].super_ShaderStageInfo.SPIRVs.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       *)local_b8);
            __p = (char *)&pSVar5[1].Serialized;
            std::
            vector<const_Diligent::SerializedShaderImpl_*,_std::allocator<const_Diligent::SerializedShaderImpl_*>_>
            ::_M_move_assign(&pSVar5->Serialized);
            uVar11 = uVar11 - 1;
            pSVar5 = pSVar5 + 1;
          } while (1 < uVar11);
          pSVar5 = (ShaderStages->
                   super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        (ShaderStages->
        super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
        )._M_impl.super__Vector_impl_data._M_finish = pSVar5 + -1;
        std::allocator_traits<std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>::
        destroy<Diligent::(anonymous_namespace)::ShaderStageInfoVk>
                  ((allocator_type *)(pSVar5 + -1),(ShaderStageInfoVk *)__p);
      }
      else {
        pSVar3 = pSVar3 + 1;
      }
    } while (pSVar3 != (ShaderStages->
                       super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    if ((ShaderStages->
        super__Vector_base<Diligent::(anonymous_namespace)::ShaderStageInfoVk,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoVk>_>
        )._M_impl.super__Vector_impl_data._M_start != pSVar3) goto LAB_001dc5df;
  }
  FormatString<char[26],char[22]>
            ((string *)local_b8,(Diligent *)"Debug expression failed:\n",
             (char (*) [26])"!ShaderStages.empty()",(char (*) [22])ActiveShaderStages);
  DebugAssertionFailed
            ((Char *)local_b8._0_8_,"ExtractShaders",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
             ,0x151);
  if ((pointer)local_b8._0_8_ != (pointer)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
  }
LAB_001dc5df:
  std::
  _Hashtable<Diligent::IShader_*,_Diligent::IShader_*,_std::allocator<Diligent::IShader_*>,_std::__detail::_Identity,_std::equal_to<Diligent::IShader_*>,_std::hash<Diligent::IShader_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<Diligent::IShader_*,_Diligent::IShader_*,_std::allocator<Diligent::IShader_*>,_std::__detail::_Identity,_std::equal_to<Diligent::IShader_*>,_std::hash<Diligent::IShader_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_68);
  return;
}

Assistant:

void ExtractShaders(const RayTracingPipelineStateCreateInfo& CreateInfo,
                    TShaderStages&                           ShaderStages,
                    bool                                     WaitUntilShadersReady,
                    SHADER_TYPE&                             ActiveShaderStages)
{
    VERIFY_EXPR(CreateInfo.PSODesc.IsRayTracingPipeline());

    std::unordered_set<IShader*> UniqueShaders;

    auto AddShader = [&ShaderStages,
                      &UniqueShaders,
                      &ActiveShaderStages,
                      WaitUntilShadersReady](IShader* pShader) {
        if (pShader != nullptr && UniqueShaders.insert(pShader).second)
        {
            const SHADER_TYPE ShaderType = pShader->GetDesc().ShaderType;
            const Int32       StageInd   = GetShaderTypePipelineIndex(ShaderType, PIPELINE_TYPE_RAY_TRACING);
            auto&             Stage      = ShaderStages[StageInd];
            ActiveShaderStages |= ShaderType;
            RefCntAutoPtr<ShaderImplType> pShaderImpl{pShader, ShaderImplType::IID_InternalImpl};
            VERIFY(pShaderImpl, "Unexpected shader object implementation");
            WaitUntilShaderReadyIfRequested(pShaderImpl, WaitUntilShadersReady);
            Stage.Append(pShaderImpl);
        }
    };

    ShaderStages.clear();
    ShaderStages.resize(MAX_SHADERS_IN_PIPELINE);
    ActiveShaderStages = SHADER_TYPE_UNKNOWN;

    for (Uint32 i = 0; i < CreateInfo.GeneralShaderCount; ++i)
    {
        AddShader(CreateInfo.pGeneralShaders[i].pShader);
    }
    for (Uint32 i = 0; i < CreateInfo.TriangleHitShaderCount; ++i)
    {
        AddShader(CreateInfo.pTriangleHitShaders[i].pClosestHitShader);
        AddShader(CreateInfo.pTriangleHitShaders[i].pAnyHitShader);
    }
    for (Uint32 i = 0; i < CreateInfo.ProceduralHitShaderCount; ++i)
    {
        AddShader(CreateInfo.pProceduralHitShaders[i].pIntersectionShader);
        AddShader(CreateInfo.pProceduralHitShaders[i].pClosestHitShader);
        AddShader(CreateInfo.pProceduralHitShaders[i].pAnyHitShader);
    }

    if (ShaderStages[GetShaderTypePipelineIndex(SHADER_TYPE_RAY_GEN, PIPELINE_TYPE_RAY_TRACING)].Count() == 0)
        LOG_ERROR_AND_THROW("At least one shader with type SHADER_TYPE_RAY_GEN must be provided.");

    // Remove empty stages
    for (auto iter = ShaderStages.begin(); iter != ShaderStages.end();)
    {
        if (iter->Count() == 0)
        {
            iter = ShaderStages.erase(iter);
        }
        else
        {
            ++iter;
        }
    }

    VERIFY_EXPR(!ShaderStages.empty());
}